

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::~IfcSlabType(IfcSlabType *this,void **vtt)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined1 *puVar3;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x88 = vtt[0x2b];
  *(void **)&this->field_0x98 = vtt[0x2c];
  *(void **)&this->field_0xf0 = vtt[0x2d];
  *(void **)&this->field_0x148 = vtt[0x2e];
  *(void **)&this->field_0x180 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0x30];
  puVar3 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x20;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  pvVar2 = vtt[2];
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x1b];
  *(void **)&this->field_0x88 = vtt[0x1c];
  *(void **)&this->field_0x98 = vtt[0x1d];
  *(void **)&this->field_0xf0 = vtt[0x1e];
  *(void **)&this->field_0x148 = vtt[0x1f];
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158,*(long *)&this->field_0x168 + 1);
  }
  pvVar2 = vtt[3];
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0x15];
  *(void **)&this->field_0x88 = vtt[0x16];
  *(void **)&this->field_0x98 = vtt[0x17];
  *(void **)&this->field_0xf0 = vtt[0x18];
  if (*(undefined1 **)&this->field_0x120 != &this->field_0x130) {
    operator_delete(*(undefined1 **)&this->field_0x120,*(long *)&this->field_0x130 + 1);
  }
  pvVar2 = *(void **)&this->field_0x100;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this->field_0x110 - (long)pvVar2);
  }
  IfcTypeObject::~IfcTypeObject((IfcTypeObject *)this,vtt + 4);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}